

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::operator=(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
            *this,vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
                  *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar3;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar4;
  undefined8 uVar5;
  size_t sVar6;
  bool *pbVar7;
  long lVar8;
  size_t sVar9;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar3 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar3;
      sVar6 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar6;
      sVar6 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar6;
    }
    else {
      sVar6 = this->nStored;
      if (sVar6 != 0) {
        pbVar7 = &this->ptr->set;
        do {
          if (*pbVar7 == true) {
            *pbVar7 = false;
          }
          pbVar7 = pbVar7 + 0x18;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      sVar6 = other->nStored;
      if (sVar6 != 0) {
        poVar3 = this->ptr;
        poVar4 = other->ptr;
        lVar8 = 0;
        sVar9 = sVar6;
        do {
          (&poVar3->set)[lVar8] = (&poVar4->set)[lVar8];
          if ((&poVar4->set)[lVar8] == true) {
            *(undefined8 *)((long)&poVar3->optionalValue + lVar8) = 0;
            puVar1 = (undefined8 *)((long)&poVar4->optionalValue + lVar8);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)&poVar3->optionalValue + lVar8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            (&poVar4->set)[lVar8] = false;
          }
          lVar8 = lVar8 + 0x18;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
      this->nStored = sVar6;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }